

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseLabelOpt(WastParser *this,string *out_label)

{
  bool bVar1;
  string_view local_88;
  string local_78;
  Token local_58;
  
  bVar1 = PeekMatch(this,Last_String);
  if (bVar1) {
    Consume(&local_58,this);
    local_88 = Token::text(&local_58);
    string_view::to_string_abi_cxx11_(&local_78,&local_88);
    std::__cxx11::string::operator=((string *)out_label,(string *)&local_78);
    std::__cxx11::string::_M_dispose();
  }
  else {
    out_label->_M_string_length = 0;
    *(out_label->_M_dataplus)._M_p = '\0';
  }
  return (Result)Ok;
}

Assistant:

Result WastParser::ParseLabelOpt(std::string* out_label) {
  WABT_TRACE(ParseLabelOpt);
  if (PeekMatch(TokenType::Var)) {
    *out_label = Consume().text().to_string();
  } else {
    out_label->clear();
  }
  return Result::Ok;
}